

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepcopy.cpp
# Opt level: O3

int __thiscall
ncnn::DeepCopy::forward(DeepCopy *this,Mat *bottom_blob,Mat *top_blob,Option *param_3)

{
  int *piVar1;
  int iVar2;
  void *in_R8;
  Mat local_50;
  
  Mat::clone(&local_50,(__fn *)bottom_blob,(void *)0x0,(int)param_3,in_R8);
  if (&local_50 != top_blob) {
    if (local_50.refcount != (int *)0x0) {
      LOCK();
      *local_50.refcount = *local_50.refcount + 1;
      UNLOCK();
    }
    piVar1 = top_blob->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (**(code **)(*(long *)top_blob->allocator + 0x18))();
        }
      }
    }
    top_blob->data = local_50.data;
    top_blob->refcount = local_50.refcount;
    top_blob->elemsize = local_50.elemsize;
    top_blob->elempack = local_50.elempack;
    top_blob->allocator = local_50.allocator;
    top_blob->dims = local_50.dims;
    top_blob->w = local_50.w;
    top_blob->h = local_50.h;
    top_blob->c = local_50.c;
    top_blob->cstep = local_50.cstep;
  }
  if (local_50.refcount != (int *)0x0) {
    LOCK();
    *local_50.refcount = *local_50.refcount + -1;
    UNLOCK();
    if (*local_50.refcount == 0) {
      if (local_50.allocator == (Allocator *)0x0) {
        if (local_50.data != (void *)0x0) {
          free(local_50.data);
        }
      }
      else {
        (**(code **)(*(long *)local_50.allocator + 0x18))();
      }
    }
  }
  if ((top_blob->data == (void *)0x0) || (iVar2 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
    iVar2 = -100;
  }
  return iVar2;
}

Assistant:

int DeepCopy::forward(const Mat& bottom_blob, Mat& top_blob, const Option& /*opt*/) const
{
    top_blob = bottom_blob.clone();
    if (top_blob.empty())
        return -100;

    return 0;
}